

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_scales(OBJ_DATA *obj,CHAR_DATA *ch)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  CHAR_DATA *victim;
  undefined1 in_stack_00001332;
  undefined1 in_stack_00001333;
  int in_stack_00001334;
  int in_stack_00001338;
  int in_stack_0000133c;
  CHAR_DATA *in_stack_00001340;
  CHAR_DATA *in_stack_00001348;
  int in_stack_00001368;
  int in_stack_00001370;
  char *in_stack_00001378;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_RSI + 0x20);
  iVar3 = *(int *)(in_RDI + 0x124);
  if (iVar3 == 0) {
    iVar3 = number_percent();
    if (0x5b < iVar3) {
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      damage_new(in_stack_00001348,in_stack_00001340,in_stack_0000133c,in_stack_00001338,
                 in_stack_00001334,(bool)in_stack_00001333,(bool)in_stack_00001332,in_stack_00001368
                 ,in_stack_00001370,in_stack_00001378);
    }
  }
  else if (iVar3 == 1) {
    iVar3 = number_percent();
    if (((0x55 < iVar3) &&
        (bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
        !bVar2)) &&
       (bVar2 = is_immortal((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)), !bVar2))
    {
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      *(undefined2 *)(*(long *)(lVar1 + 0xc0) + 0x3e2) = 5;
      *(undefined2 *)(*(long *)(lVar1 + 0xc0) + 0x3e0) = 5;
    }
  }
  else if ((iVar3 == 2) && (iVar3 = number_percent(), 0x55 < iVar3)) {
    act(in_stack_ffffffffffffffd0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    act(in_stack_ffffffffffffffd0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    iVar3 = number_percent();
    if (iVar3 < 0x33) {
      *(short *)(in_RSI + 0x15e) = *(short *)(in_RSI + 0x15e) + *(short *)(in_RSI + 0x138);
    }
    else {
      *(int *)(in_RSI + 0x158) = (int)*(short *)(in_RSI + 0x138) + *(int *)(in_RSI + 0x158);
    }
  }
  return;
}

Assistant:

void fight_prog_scales(OBJ_DATA *obj, CHAR_DATA *ch)
{
	CHAR_DATA *victim = ch->fighting;

	switch (obj->value[2])
	{
		case 0:
			if (number_percent() > 91)
			{
				act("Ethereal green tendrils reach out of your tattoo and lash out at $N!", ch, obj, victim, TO_CHAR);
				act("Ethereal green tendrils reach out of $n's tattoo and lash out at you!", ch, obj, victim, TO_VICT);
				act("Ethereal green tendrils reach out of $n's tattoo and lash out at $N!", ch, obj, victim, TO_ROOM);

				damage_new(ch, victim, ch->level, TYPE_UNDEFINED, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "lashing tendrils");
			}

			break;
		case 1:
			if (number_percent() > 85 && !is_npc(victim) && !is_immortal(victim))
			{
				act("$N's $p begins to glow, and you feel drained.", victim, obj, ch, TO_VICT);
				act("Your $p begins to glow as it drains energy from $n.", ch, obj, victim, TO_CHAR);

				victim->pcdata->condition[COND_HUNGER] = 5;
				victim->pcdata->condition[COND_THIRST] = 5;
			}

			break;
		case 2:
			if (number_percent() > 85)
			{
				act("$p throbs momentarily, and you feel invigorated!", ch, obj, 0, TO_CHAR);
				act("$n looks a bit more refreshed.", ch, obj, 0, TO_ROOM);

				if (number_percent() > 50)
					ch->hit += ch->level;
				else
					ch->mana += ch->level;
			}
			break;
	}
}